

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

void wabt::anon_unknown_1::AppendInlineExportFields
               (Module *module,ModuleFieldList *fields,Index index)

{
  ModuleField *pMVar1;
  Location last_field_loc;
  Location local_98;
  Var local_78;
  
  if ((module->fields).size_ == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                  ,400,
                  "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::ModuleField>::back() [T = wabt::ModuleField]"
                 );
  }
  pMVar1 = (module->fields).last_;
  local_98.filename._M_len = (pMVar1->loc).filename._M_len;
  local_98.filename._M_str = (pMVar1->loc).filename._M_str;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (pMVar1->loc).field_1.field_1.offset;
  local_98.field_1._8_8_ = *(undefined8 *)((long)&(pMVar1->loc).field_1 + 8);
  pMVar1 = fields->first_;
  if (pMVar1 != (ModuleField *)0x0) {
    do {
      if (pMVar1->type_ != Export) {
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                      ,0x4e,
                      "Derived *wabt::cast(Base *) [Derived = wabt::ExportModuleField, Base = wabt::ModuleField]"
                     );
      }
      Var::Var(&local_78,index,&local_98);
      Var::operator=((Var *)&pMVar1[1].loc.field_1.field_0,&local_78);
      Var::~Var(&local_78);
      pMVar1 = (pMVar1->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar1 != (ModuleField *)0x0);
  }
  Module::AppendFields(module,fields);
  return;
}

Assistant:

Result CheckTypes(const Location& loc,
                  const TypeVector& actual,
                  const TypeVector& expected,
                  const char* desc,
                  const char* index_kind,
                  Errors* errors) {
  Result result = Result::Ok;
  if (actual.size() == expected.size()) {
    for (size_t i = 0; i < actual.size(); ++i) {
      result |= CheckTypeIndex(loc, actual[i], expected[i], desc, i, index_kind,
                               errors);
    }
  } else {
    errors->emplace_back(
        ErrorLevel::Error, loc,
        StringPrintf("expected %" PRIzd " %ss, got %" PRIzd, expected.size(),
                     index_kind, actual.size()));
    result = Result::Error;
  }
  return result;
}